

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRex.c
# Opt level: O2

word Gia_ManAutomInit(Gia_Man_t *p)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  uint uVar4;
  int v;
  ulong uVar5;
  
  v = 0;
  uVar5 = 0;
  while( true ) {
    if (p->nObjs <= v) {
      return uVar5;
    }
    pGVar2 = Gia_ManObj(p,v);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    uVar4 = (uint)*(ulong *)pGVar2;
    uVar3 = *(ulong *)pGVar2 & 0x1fffffff;
    if (uVar3 != 0x1fffffff && -1 < (int)uVar4) {
      if (((uVar4 >> 0x1d & 1) != 0) &&
         (((undefined1  [12])pGVar2[-uVar3] & (undefined1  [12])0x9fffffff) ==
          (undefined1  [12])0x9fffffff)) {
        iVar1 = Gia_ObjCioId(pGVar2 + -uVar3);
        iVar1 = (p->nRegs - p->vCis->nSize) + iVar1;
        if (-1 < iVar1) {
          uVar5 = uVar5 | 1L << ((ulong)(byte)(0x3f - (char)iVar1) & 0x3f);
        }
      }
      if (((*(ulong *)pGVar2 >> 0x3d & 1) != 0) &&
         (uVar3 = (ulong)((uint)(*(ulong *)pGVar2 >> 0x20) & 0x1fffffff),
         ((undefined1  [12])pGVar2[-uVar3] & (undefined1  [12])0x9fffffff) ==
         (undefined1  [12])0x9fffffff)) {
        iVar1 = Gia_ObjCioId(pGVar2 + -uVar3);
        iVar1 = (p->nRegs - p->vCis->nSize) + iVar1;
        if (-1 < iVar1) {
          uVar5 = uVar5 | 1L << ((ulong)(byte)(0x3f - (char)iVar1) & 0x3f);
        }
      }
    }
    v = v + 1;
  }
  return uVar5;
}

Assistant:

word Gia_ManAutomInit( Gia_Man_t * p )
{
    Gia_Obj_t * pObj; 
    int i, Index;
    word Init = 0;
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( Gia_ObjFaninC0(pObj) && Gia_ObjIsCi(Gia_ObjFanin0(pObj)) )
        {
            Index = Gia_ObjCioId(Gia_ObjFanin0(pObj)) - Gia_ManPiNum(p);
            if ( Index >= 0 )
                Init |= ((word)1 << (63-Index));
        }
        if ( Gia_ObjFaninC1(pObj) && Gia_ObjIsCi(Gia_ObjFanin1(pObj)) )
        {
            Index = Gia_ObjCioId(Gia_ObjFanin1(pObj)) - Gia_ManPiNum(p);
            if ( Index >= 0 )
                Init |= ((word)1 << (63-Index));
        }
    }
    return Init;
}